

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

double units::getPrefixMultiplier(char p)

{
  undefined1 in_DIL;
  double local_8;
  
  switch(in_DIL) {
  case 0x41:
  case 0x61:
    local_8 = precise_unit::multiplier((precise_unit *)precise::atto);
    break;
  case 0x42:
  case 0x47:
    local_8 = precise_unit::multiplier((precise_unit *)precise::giga);
    break;
  case 0x43:
  case 99:
    local_8 = precise_unit::multiplier((precise_unit *)precise::centi);
    break;
  case 0x44:
  case 100:
    local_8 = precise_unit::multiplier((precise_unit *)precise::deci);
    break;
  case 0x45:
    local_8 = precise_unit::multiplier((precise_unit *)precise::exa);
    break;
  case 0x46:
  case 0x66:
    local_8 = precise_unit::multiplier((precise_unit *)precise::femto);
    break;
  case 0x48:
  case 0x68:
    local_8 = precise_unit::multiplier((precise_unit *)precise::hecto);
    break;
  case 0x4b:
  case 0x6b:
    local_8 = precise_unit::multiplier((precise_unit *)precise::kilo);
    break;
  case 0x4d:
    local_8 = precise_unit::multiplier((precise_unit *)precise::mega);
    break;
  case 0x50:
    local_8 = precise_unit::multiplier((precise_unit *)precise::peta);
    break;
  case 0x51:
    local_8 = precise_unit::multiplier((precise_unit *)precise::quetta);
    break;
  case 0x52:
    local_8 = precise_unit::multiplier((precise_unit *)precise::ronna);
    break;
  case 0x54:
    local_8 = precise_unit::multiplier((precise_unit *)precise::tera);
    break;
  case 0x59:
    local_8 = precise_unit::multiplier((precise_unit *)precise::yotta);
    break;
  case 0x5a:
    local_8 = precise_unit::multiplier((precise_unit *)precise::zetta);
    break;
  case 0x6d:
    local_8 = precise_unit::multiplier((precise_unit *)precise::milli);
    break;
  case 0x6e:
    local_8 = precise_unit::multiplier((precise_unit *)precise::nano);
    break;
  case 0x70:
    local_8 = precise_unit::multiplier((precise_unit *)precise::pico);
    break;
  case 0x71:
    local_8 = precise_unit::multiplier((precise_unit *)precise::quecto);
    break;
  case 0x72:
    local_8 = precise_unit::multiplier((precise_unit *)precise::ronto);
    break;
  case 0x79:
    local_8 = precise_unit::multiplier((precise_unit *)precise::yocto);
    break;
  case 0x7a:
    local_8 = precise_unit::multiplier((precise_unit *)precise::zepto);
    break;
  case 0xffffffb5:
  case 0x55:
  case 0x75:
    local_8 = precise_unit::multiplier((precise_unit *)precise::micro);
    break;
  default:
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

static double getPrefixMultiplier(char p)
{
    switch (p) {
        case 'm':
            return precise::milli.multiplier();
        case 'k':
        case 'K':
            return precise::kilo.multiplier();
        case 'M':
            return precise::mega.multiplier();
        case 'u':
        case 'U':
        case '\xB5':  // latin-1 encoding "micro"
            return precise::micro.multiplier();
        case 'd':
        case 'D':
            return precise::deci.multiplier();
        case 'c':
        case 'C':
            return precise::centi.multiplier();
        case 'h':
        case 'H':
            return precise::hecto.multiplier();
        case 'n':
            return precise::nano.multiplier();
        case 'p':
            return precise::pico.multiplier();
        case 'G':
        case 'B':  // Billion
            return precise::giga.multiplier();
        case 'T':
            return precise::tera.multiplier();
        case 'f':
        case 'F':
            return precise::femto.multiplier();
        case 'E':
            return precise::exa.multiplier();
        case 'P':
            return precise::peta.multiplier();
        case 'Z':
            return precise::zetta.multiplier();
        case 'Y':
            return precise::yotta.multiplier();
        case 'y':
            return precise::yocto.multiplier();
        case 'a':
        case 'A':
            return precise::atto.multiplier();
        case 'z':
            return precise::zepto.multiplier();
        case 'R':
            return precise::ronna.multiplier();
        case 'r':
            return precise::ronto.multiplier();
        case 'Q':
            return precise::quetta.multiplier();
        case 'q':
            return precise::quecto.multiplier();
        default:
            return 0.0;
    }
}